

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

void Assimp::IFC::ConvertAxisPlacement(IfcMatrix4 *out,IfcAxis2Placement3D *in)

{
  IfcCartesianPoint *in_00;
  Lazy<Assimp::IFC::Schema_2x3::IfcDirection> *pLVar1;
  IfcDirection *pIVar2;
  aiVector3t<double> *paVar3;
  double dVar4;
  IfcVector3 loc;
  IfcVector3 local_b8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  IfcVector3 local_70;
  IfcVector3 local_58;
  aiVector3t<double> local_38;
  
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_58.z = 0.0;
  in_00 = STEP::Lazy::operator_cast_to_IfcCartesianPoint_
                    ((Lazy *)&(in->super_IfcPlacement).super_IfcGeometricRepresentationItem.
                              field_0x30);
  ConvertCartesianPoint(&local_58,in_00);
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  local_b8.z = 1.0;
  local_70.x = 1.0;
  local_70.y = 0.0;
  local_70.z = 0.0;
  if (in->field_0x50 == '\x01') {
    pLVar1 = STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                       ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *)
                        &(in->super_IfcPlacement).field_0x48);
    pIVar2 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::operator*(pLVar1);
    ConvertDirection(&local_b8,pIVar2);
  }
  if ((in->RefDirection).have == true) {
    pLVar1 = STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                       (&in->RefDirection);
    pIVar2 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::operator*(pLVar1);
    ConvertDirection(&local_70,pIVar2);
  }
  paVar3 = aiVector3t<double>::Normalize(&local_70);
  dVar4 = paVar3->z * local_b8.z + paVar3->x * local_b8.x + paVar3->y * local_b8.y;
  local_38.x = paVar3->x - dVar4 * local_b8.x;
  local_38.y = paVar3->y - dVar4 * local_b8.y;
  local_38.z = paVar3->z - local_b8.z * dVar4;
  paVar3 = aiVector3t<double>::Normalize(&local_38);
  local_90 = paVar3->x;
  local_a0 = paVar3->y;
  local_80 = paVar3->z;
  local_78 = local_b8.y * local_80 - local_a0 * local_b8.z;
  local_88 = local_b8.z * local_90 - local_80 * local_b8.x;
  local_98 = local_b8.x * local_a0 - local_90 * local_b8.y;
  aiMatrix4x4t<double>::Translation(&local_58,out);
  out->a1 = local_90;
  out->b1 = local_a0;
  out->c1 = local_80;
  out->a2 = local_78;
  out->b2 = local_88;
  out->c2 = local_98;
  out->a3 = local_b8.x;
  out->b3 = local_b8.y;
  out->c3 = local_b8.z;
  return;
}

Assistant:

void ConvertAxisPlacement(IfcMatrix4& out, const Schema_2x3::IfcAxis2Placement3D& in)
{
    IfcVector3 loc;
    ConvertCartesianPoint(loc,in.Location);

    IfcVector3 z(0.f,0.f,1.f),r(1.f,0.f,0.f),x;

    if (in.Axis) {
        ConvertDirection(z,*in.Axis.Get());
    }
    if (in.RefDirection) {
        ConvertDirection(r,*in.RefDirection.Get());
    }

    IfcVector3 v = r.Normalize();
    IfcVector3 tmpx = z * (v*z);

    x = (v-tmpx).Normalize();
    IfcVector3 y = (z^x);

    IfcMatrix4::Translation(loc,out);
    AssignMatrixAxes(out,x,y,z);
}